

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

lws_check_basic_auth_results
lws_check_basic_auth(lws *wsi,char *basic_auth_login_file,uint auth_mode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  int bar;
  int fi;
  int ml;
  int m;
  char *pcolon;
  char plain [120];
  char local_c8 [5];
  undefined1 local_c3;
  char acStack_c2 [2];
  char b64 [160];
  uint auth_mode_local;
  char *basic_auth_login_file_local;
  lws *wsi_local;
  
  if ((basic_auth_login_file == (char *)0x0) && (auth_mode == 0)) {
    wsi_local._4_4_ = LCBA_CONTINUE;
  }
  else {
    b64._156_4_ = auth_mode;
    iVar1 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_AUTHORIZATION);
    if (iVar1 == 0) {
      wsi_local._4_4_ = LCBA_FAILED_AUTH;
    }
    else {
      uVar2 = (uint)((wsi->http).ah)->frag_index[0x19];
      if (((wsi->http).ah)->frags[(int)uVar2].nfrag == '\0') {
        iVar3 = lws_hdr_copy(wsi,local_c8,0xa0,WSI_TOKEN_HTTP_AUTHORIZATION);
        if (iVar3 < 7) {
          _lws_log(1,"b64 auth too long\n");
          wsi_local._4_4_ = LCBA_END_TRANSACTION;
        }
        else {
          local_c3 = 0;
          iVar3 = strcasecmp(local_c8,"Basic");
          if (iVar3 == 0) {
            iVar3 = lws_b64_decode_string(acStack_c2,(char *)&pcolon,0x77);
            if (iVar3 < 0) {
              _lws_log(1,"plain auth too long\n");
              wsi_local._4_4_ = LCBA_END_TRANSACTION;
            }
            else {
              plain[(long)iVar3 + -8] = '\0';
              pcVar4 = strchr((char *)&pcolon,0x3a);
              if (pcVar4 == (char *)0x0) {
                _lws_log(1,"basic auth format broken\n");
                wsi_local._4_4_ = LCBA_END_TRANSACTION;
              }
              else {
                if (b64._156_4_ == 0) {
                  iVar3 = lws_find_string_in_file(basic_auth_login_file,(char *)&pcolon,iVar3);
                  if (iVar3 == 0) {
                    _lws_log(1,"%s: basic auth lookup failed\n","lws_check_basic_auth");
                    return LCBA_FAILED_AUTH;
                  }
                }
                else {
                  if (b64._156_4_ != 0x10000000) {
                    return LCBA_FAILED_AUTH;
                  }
                  iVar3 = (*((wsi->a).protocol)->callback)
                                    (wsi,LWS_CALLBACK_VERIFY_BASIC_AUTHORIZATION,wsi->user_space,
                                     &pcolon,(size_t)iVar3);
                  if (iVar3 == 0) {
                    return LCBA_FAILED_AUTH;
                  }
                }
                *pcVar4 = '\0';
                ((wsi->http).ah)->frags[(int)uVar2].len = (short)pcVar4 - (short)&pcolon;
                pcVar4 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP_AUTHORIZATION);
                strncpy(pcVar4,(char *)&pcolon,(ulong)(iVar1 - 1));
                pcVar4[iVar1 + -1] = '\0';
                pcVar4 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP_AUTHORIZATION);
                _lws_log(8,"%s: basic auth accepted for %s\n","lws_check_basic_auth",pcVar4);
                wsi_local._4_4_ = LCBA_CONTINUE;
              }
            }
          }
          else {
            _lws_log(1,"auth missing basic: %s\n",local_c8);
            wsi_local._4_4_ = LCBA_END_TRANSACTION;
          }
        }
      }
      else {
        _lws_log(1,"fragmented basic auth header not allowed\n");
        wsi_local._4_4_ = LCBA_FAILED_AUTH;
      }
    }
  }
  return wsi_local._4_4_;
}

Assistant:

enum lws_check_basic_auth_results
lws_check_basic_auth(struct lws *wsi, const char *basic_auth_login_file,
		     unsigned int auth_mode)
{
#if defined(LWS_WITH_FILE_OPS)
	char b64[160], plain[(sizeof(b64) * 3) / 4], *pcolon;
	int m, ml, fi, bar;

	if (!basic_auth_login_file && auth_mode == LWSAUTHM_DEFAULT)
		return LCBA_CONTINUE;

	/* Did he send auth? */
	ml = lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_AUTHORIZATION);
	if (!ml)
		return LCBA_FAILED_AUTH;

	/* Disallow fragmentation monkey business */

	fi = wsi->http.ah->frag_index[WSI_TOKEN_HTTP_AUTHORIZATION];
	if (wsi->http.ah->frags[fi].nfrag) {
		lwsl_err("fragmented basic auth header not allowed\n");
		return LCBA_FAILED_AUTH;
	}

	m = lws_hdr_copy(wsi, b64, sizeof(b64),
			 WSI_TOKEN_HTTP_AUTHORIZATION);
	if (m < 7) {
		lwsl_err("b64 auth too long\n");
		return LCBA_END_TRANSACTION;
	}

	b64[5] = '\0';
	if (strcasecmp(b64, "Basic")) {
		lwsl_err("auth missing basic: %s\n", b64);
		return LCBA_END_TRANSACTION;
	}

	/* It'll be like Authorization: Basic QWxhZGRpbjpPcGVuU2VzYW1l */

	m = lws_b64_decode_string(b64 + 6, plain, sizeof(plain) - 1);
	if (m < 0) {
		lwsl_err("plain auth too long\n");
		return LCBA_END_TRANSACTION;
	}

	plain[m] = '\0';
	pcolon = strchr(plain, ':');
	if (!pcolon) {
		lwsl_err("basic auth format broken\n");
		return LCBA_END_TRANSACTION;
	}

	switch (auth_mode) {
	case LWSAUTHM_DEFAULT:
		if (lws_find_string_in_file(basic_auth_login_file, plain, m))
			break;
		lwsl_err("%s: basic auth lookup failed\n", __func__);
		return LCBA_FAILED_AUTH;

	case LWSAUTHM_BASIC_AUTH_CALLBACK:
		bar = wsi->a.protocol->callback(wsi,
				LWS_CALLBACK_VERIFY_BASIC_AUTHORIZATION,
				wsi->user_space, plain, (unsigned int)m);
		if (!bar)
			return LCBA_FAILED_AUTH;
		break;
	default:
		/* Invalid auth mode so lets fail all authentication attempts */
		return LCBA_FAILED_AUTH;
	}

	/*
	 * Rewrite WSI_TOKEN_HTTP_AUTHORIZATION so it is just the
	 * authorized username
	 */

	*pcolon = '\0';
	wsi->http.ah->frags[fi].len = (uint16_t)lws_ptr_diff_size_t(pcolon, &plain[0]);
	pcolon = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_AUTHORIZATION);
	strncpy(pcolon, plain, (unsigned int)(ml - 1));
	pcolon[ml - 1] = '\0';
	lwsl_info("%s: basic auth accepted for %s\n", __func__,
		 lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_AUTHORIZATION));

	return LCBA_CONTINUE;
#else
	return LCBA_FAILED_AUTH;
#endif
}